

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_index_tests.cpp
# Opt level: O2

bool __thiscall
blockfilter_index_tests::BuildChainTestingSetup::BuildChain
          (BuildChainTestingSetup *this,CBlockIndex *pindex,CScript *coinbase_script_pub_key,
          size_t length,
          vector<std::shared_ptr<CBlock>,_std::allocator<std::shared_ptr<CBlock>_>_> *chain)

{
  __shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChainstateManager *this_00;
  __shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  __shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2> *this_01;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar4;
  long lVar5;
  CBlock *pCVar6;
  CBlock *pCVar7;
  long in_FS_OFFSET;
  byte bVar8;
  span<const_CBlockHeader,_18446744073709551615UL> headers;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> no_txns;
  CBlockIndex *pindex_local;
  undefined1 local_140 [80];
  BlockValidationState state;
  CBlockHeader header;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_58;
  long local_38;
  
  bVar8 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  no_txns.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  no_txns.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  no_txns.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pindex_local = pindex;
  std::vector<std::shared_ptr<CBlock>,_std::allocator<std::shared_ptr<CBlock>_>_>::resize
            (chain,length);
  p_Var1 = &((chain->
             super__Vector_base<std::shared_ptr<CBlock>,_std::allocator<std::shared_ptr<CBlock>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>;
  p_Var2 = &((chain->
             super__Vector_base<std::shared_ptr<CBlock>,_std::allocator<std::shared_ptr<CBlock>_>_>)
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>;
  do {
    this_01 = p_Var2;
    if (this_01 == p_Var1) break;
    CreateBlock((CBlock *)&header,this,pindex_local,&no_txns,coinbase_script_pub_key);
    std::make_shared<CBlock,CBlock>((CBlock *)local_140);
    std::__shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_01,(__shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2> *)local_140);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_140 + 8));
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&local_58);
    CBlock::GetBlockHeader(&header,this_01->_M_ptr);
    state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
    state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] =
         '\0';
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
         '\0';
    puVar4 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                       (&(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                         super_BasicTestingSetup.m_node.chainman,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_index_tests.cpp"
                        ,0x6a,"BuildChain","m_node.chainman");
    this_00 = (puVar4->_M_t).
              super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t
              .super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
              super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
    pCVar6 = (CBlock *)&header;
    pCVar7 = (CBlock *)local_140;
    for (lVar5 = 0x14; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pCVar7->super_CBlockHeader).nVersion = (pCVar6->super_CBlockHeader).nVersion;
      pCVar6 = (CBlock *)((long)pCVar6 + (ulong)bVar8 * -8 + 4);
      pCVar7 = (CBlock *)((long)pCVar7 + (ulong)bVar8 * -8 + 4);
    }
    headers._M_extent._M_extent_value = 1;
    headers._M_ptr = (pointer)local_140;
    bVar3 = ChainstateManager::ProcessNewBlockHeaders
                      (this_00,headers,true,
                       (BlockValidationState *)&state.super_ValidationState<BlockValidationResult>,
                       &pindex_local);
    ValidationState<BlockValidationResult>::~ValidationState
              (&state.super_ValidationState<BlockValidationResult>);
    p_Var2 = this_01 + 1;
  } while (bVar3);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector(&no_txns);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this_01 == p_Var1;
  }
  __stack_chk_fail();
}

Assistant:

bool BuildChainTestingSetup::BuildChain(const CBlockIndex* pindex,
    const CScript& coinbase_script_pub_key,
    size_t length,
    std::vector<std::shared_ptr<CBlock>>& chain)
{
    std::vector<CMutableTransaction> no_txns;

    chain.resize(length);
    for (auto& block : chain) {
        block = std::make_shared<CBlock>(CreateBlock(pindex, no_txns, coinbase_script_pub_key));
        CBlockHeader header = block->GetBlockHeader();

        BlockValidationState state;
        if (!Assert(m_node.chainman)->ProcessNewBlockHeaders({{header}}, true, state, &pindex)) {
            return false;
        }
    }

    return true;
}